

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O1

void __thiscall SStringView_Clear_Test::TestBody(SStringView_Clear_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  string abc_str;
  sstring_view<const_char_*> empty;
  string empty_str;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  AssertHelper local_70;
  sstring_view<const_char_*> local_68;
  long local_58 [2];
  sstring_view<const_char_*> local_48;
  char *local_38;
  undefined8 local_30;
  char local_28;
  undefined7 uStack_27;
  
  local_30 = 0;
  local_28 = '\0';
  local_48.size_ = 0;
  local_68.ptr_ = (char *)local_58;
  local_48.ptr_ = &local_28;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"abc","");
  local_80 = (undefined1  [8])local_68.ptr_;
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_90,"sv1.size ()","0U",(unsigned_long *)&local_98,(uint *)&local_70);
  if (local_90._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x122,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  testing::internal::
  CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
            ((internal *)&local_90,"sv1","empty",(sstring_view<const_char_*> *)local_80,&local_48);
  if (local_90._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x123,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  if ((long *)local_68.ptr_ != local_58) {
    operator_delete(local_68.ptr_,local_58[0] + 1);
  }
  local_68.ptr_ = local_38;
  local_68.size_ = 0;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._M_head_impl = local_98._M_head_impl & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_80,"sv2.size ()","0U",(unsigned_long *)&local_90,(uint *)&local_98);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x129,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  testing::internal::
  CmpHelperEQ<pstore::sstring_view<char_const*>,pstore::sstring_view<char_const*>>
            ((internal *)local_80,"sv2","empty",&local_68,&local_48);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x12a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  return;
}

Assistant:

TEST (SStringView, RBeginEmpty) {
    std::string const src;
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());
    sv_type const & csv = sv;

    sv_type::reverse_iterator rbegin = sv.rbegin ();
    sv_type::const_reverse_iterator const_rbegin1 = csv.rbegin ();
    sv_type::const_reverse_iterator const_rbegin2 = sv.crbegin ();
    EXPECT_EQ (rbegin, const_rbegin1);
    EXPECT_EQ (rbegin, const_rbegin2);
    EXPECT_EQ (const_rbegin1, const_rbegin2);
}